

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitSwitch(Graph *this,Switch *curr)

{
  bool bVar1;
  Name *pNVar2;
  reference pNVar3;
  mapped_type *this_00;
  Iterator IVar4;
  undefined1 auStack_e8 [8];
  Name target_1;
  _Node_iterator_base<wasm::Name,_true> local_d0;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range3_1;
  undefined1 auStack_98 [8];
  Name target;
  Iterator __end3;
  undefined1 local_68 [8];
  Iterator __begin3;
  ArenaVector<wasm::Name> *__range3;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  targets;
  Switch *curr_local;
  Graph *this_local;
  
  targets._M_h._M_single_bucket = (__node_base_ptr)curr;
  Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
            ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->condition);
  bVar1 = isInUnreachable(this);
  if (!bVar1) {
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&__range3);
    __begin3.index = (size_t)(targets._M_h._M_single_bucket + 2);
    IVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::begin
                      ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)__begin3.index);
    __begin3.parent = (ArenaVector<wasm::Name> *)IVar4.index;
    local_68 = (undefined1  [8])IVar4.parent;
    IVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::end
                      ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)__begin3.index);
    target.super_IString.str._M_str = (char *)IVar4.parent;
    while( true ) {
      bVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator!=
                        ((Iterator *)local_68,(Iterator *)&target.super_IString.str._M_str);
      if (!bVar1) break;
      pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                         ((Iterator *)local_68);
      auStack_98 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
      target.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&__range3,(value_type *)auStack_98);
      ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator++
                ((Iterator *)local_68);
    }
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              *)&__range3,(value_type *)(targets._M_h._M_single_bucket + 6));
    __end3_1 = std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::begin((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&__range3);
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
         ::end((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&__range3);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end3_1.super__Node_iterator_base<wasm::Name,_true>,&local_d0);
      if (!bVar1) break;
      pNVar3 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3_1);
      auStack_e8 = (undefined1  [8])(pNVar3->super_IString).str._M_len;
      target_1.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
      this_00 = std::
                unordered_map<wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>_>
                ::operator[](&this->breakStates,(key_type *)auStack_e8);
      std::
      vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
      ::push_back(this_00,&this->locals);
      std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3_1);
    }
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)&__range3);
  }
  setInUnreachable(this);
  return &this->bad;
}

Assistant:

Node* doVisitSwitch(Switch* curr) {
    visit(curr->condition);
    if (!isInUnreachable()) {
      std::unordered_set<Name> targets;
      for (auto target : curr->targets) {
        targets.insert(target);
      }
      targets.insert(curr->default_);
      for (auto target : targets) {
        breakStates[target].push_back(locals);
      }
    }
    setInUnreachable();
    return &bad;
  }